

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::ColdChunkSkipper::OnEndChunk
          (ColdChunkSkipper *this,int chunk,Printer *printer)

{
  bool bVar1;
  undefined1 local_60 [8];
  Formatter format;
  Printer *printer_local;
  int chunk_local;
  ColdChunkSkipper *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_60,printer,&this->variables_);
  bVar1 = chunk == this->limit_chunk_ + -1;
  if (bVar1) {
    Formatter::Outdent((Formatter *)local_60);
    Formatter::operator()<>((Formatter *)local_60,"}\n");
  }
  Formatter::~Formatter((Formatter *)local_60);
  return bVar1;
}

Assistant:

bool ColdChunkSkipper::OnEndChunk(int chunk, io::Printer* printer) {
  Formatter format(printer, variables_);
  if (chunk != limit_chunk_ - 1) {
    return false;
  }
  format.Outdent();
  format("}\n");
  return true;
}